

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O3

compile_errcode __thiscall Statement::Action(Statement *this)

{
  pointer pcVar1;
  SymbolName SVar2;
  compile_errcode cVar3;
  StatementList *pSVar4;
  SymbolQueue *this_00;
  SymbolType function_type;
  string funtion_name;
  string str;
  SymbolType local_a4;
  _func_int **local_a0;
  _func_int **local_98;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_a4 = SymbolTableTree::GetCurrentTableType(symbol_table_tree);
  local_90 = local_80;
  pcVar1 = (symbol_table_tree->current_table_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,
             pcVar1 + (symbol_table_tree->current_table_name)._M_string_length);
  SVar2 = SymbolQueue::GetCurrentName(handle_correct_queue);
  SymbolQueue::SetCacheLocate(handle_correct_queue);
  if (SVar2 == L_CURLY_BRACKET_SYM) {
    SymbolQueue::NextSymbol(handle_correct_queue);
    pSVar4 = (StatementList *)operator_new(0x1f0);
    local_a0 = (_func_int **)&PTR_Parse_001728d8;
    (pSVar4->super_AnalysisInterface)._vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001728d8;
    (pSVar4->m_statement).super_AnalysisInterface._vptr_AnalysisInterface =
         (_func_int **)&PTR_Parse_00172618;
    (pSVar4->m_statement).m_output_statement.super_AnalysisInterface._vptr_AnalysisInterface =
         (_func_int **)&PTR_Parse_00172510;
    (pSVar4->m_statement).m_output_statement.m_expression.super_AnalysisInterface.
    _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001721f8;
    (pSVar4->m_statement).m_output_statement.m_expression.m_term.super_AnalysisInterface.
    _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172250;
    (pSVar4->m_statement).m_input_statement.super_AnalysisInterface._vptr_AnalysisInterface =
         (_func_int **)&PTR_Parse_00172460;
    (pSVar4->m_statement).m_return_statement.super_AnalysisInterface._vptr_AnalysisInterface =
         (_func_int **)&PTR_Parse_001724b8;
    (pSVar4->m_statement).m_return_statement.m_expression.super_AnalysisInterface.
    _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001721f8;
    (pSVar4->m_statement).m_return_statement.m_expression.m_term.super_AnalysisInterface.
    _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172250;
    local_98 = (_func_int **)&PTR_Parse_00172568;
    (pSVar4->m_statement).m_assign_statement.super_AnalysisInterface._vptr_AnalysisInterface =
         (_func_int **)&PTR_Parse_00172568;
    (pSVar4->m_statement).m_assign_statement.m_expression.super_AnalysisInterface.
    _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001721f8;
    (pSVar4->m_statement).m_assign_statement.m_expression.m_term.super_AnalysisInterface.
    _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172250;
    (pSVar4->m_statement).m_assign_statement.m_identifier_name._M_dataplus._M_p =
         (pointer)&(pSVar4->m_statement).m_assign_statement.m_identifier_name.field_2;
    (pSVar4->m_statement).m_assign_statement.m_identifier_name._M_string_length = 0;
    (pSVar4->m_statement).m_assign_statement.m_identifier_name.field_2._M_local_buf[0] = '\0';
    (pSVar4->m_statement).m_function_call.super_AnalysisInterface._vptr_AnalysisInterface =
         (_func_int **)&PTR_Parse_00172670;
    (pSVar4->m_statement).m_function_call.m_value_argument_list.super_AnalysisInterface.
    _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001722a8;
    (pSVar4->m_statement).m_function_call.m_value_argument_list.m_expression.super_AnalysisInterface
    ._vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001721f8;
    (pSVar4->m_statement).m_function_call.m_value_argument_list.m_expression.m_term.
    super_AnalysisInterface._vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172250;
    (pSVar4->m_statement).m_condition_statement.super_AnalysisInterface._vptr_AnalysisInterface =
         (_func_int **)&PTR_Parse_001726c8;
    (pSVar4->m_statement).m_condition_statement.m_condition.super_AnalysisInterface.
    _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001725c0;
    (pSVar4->m_statement).m_condition_statement.m_condition.m_expression.super_AnalysisInterface.
    _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001721f8;
    (pSVar4->m_statement).m_condition_statement.m_condition.m_expression.m_term.
    super_AnalysisInterface._vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172250;
    (pSVar4->m_statement).m_condition_statement.m_bottom_label._M_dataplus._M_p =
         (pointer)&(pSVar4->m_statement).m_condition_statement.m_bottom_label.field_2;
    (pSVar4->m_statement).m_condition_statement.m_bottom_label._M_string_length = 0;
    (pSVar4->m_statement).m_condition_statement.m_bottom_label.field_2._M_local_buf[0] = '\0';
    (pSVar4->m_statement).m_while_loop_statement.super_AnalysisInterface._vptr_AnalysisInterface =
         (_func_int **)&PTR_Parse_00172720;
    (pSVar4->m_statement).m_while_loop_statement.m_condition.super_AnalysisInterface.
    _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001725c0;
    (pSVar4->m_statement).m_while_loop_statement.m_condition.m_expression.super_AnalysisInterface.
    _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001721f8;
    (pSVar4->m_statement).m_while_loop_statement.m_condition.m_expression.m_term.
    super_AnalysisInterface._vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172250;
    (pSVar4->m_statement).m_while_loop_statement.m_top_label._M_dataplus._M_p =
         (pointer)&(pSVar4->m_statement).m_while_loop_statement.m_top_label.field_2;
    (pSVar4->m_statement).m_while_loop_statement.m_top_label._M_string_length = 0;
    (pSVar4->m_statement).m_while_loop_statement.m_top_label.field_2._M_local_buf[0] = '\0';
    (pSVar4->m_statement).m_while_loop_statement.m_bottom_label._M_dataplus._M_p =
         (pointer)&(pSVar4->m_statement).m_while_loop_statement.m_bottom_label.field_2;
    (pSVar4->m_statement).m_while_loop_statement.m_bottom_label._M_string_length = 0;
    (pSVar4->m_statement).m_while_loop_statement.m_bottom_label.field_2._M_local_buf[0] = '\0';
    (pSVar4->m_statement).m_switch_statement.super_AnalysisInterface._vptr_AnalysisInterface =
         (_func_int **)&PTR_Parse_00172778;
    (pSVar4->m_statement).m_switch_statement.m_expression.super_AnalysisInterface.
    _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001721f8;
    (pSVar4->m_statement).m_switch_statement.m_expression.m_term.super_AnalysisInterface.
    _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172250;
    (pSVar4->m_statement).m_switch_statement.m_switch_table.super_AnalysisInterface.
    _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001727d0;
    (pSVar4->m_statement).m_switch_statement.m_switch_table.m_switch_child_statement.
    super_AnalysisInterface._vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172828;
    (pSVar4->m_statement).m_switch_statement.m_default.super_AnalysisInterface.
    _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172880;
    (pSVar4->m_statement).m_switch_statement.m_bottom_label._M_dataplus._M_p =
         (pointer)&(pSVar4->m_statement).m_switch_statement.m_bottom_label.field_2;
    (pSVar4->m_statement).m_switch_statement.m_bottom_label._M_string_length = 0;
    (pSVar4->m_statement).m_switch_statement.m_bottom_label.field_2._M_local_buf[0] = '\0';
    this->m_statement_list_ptr = pSVar4;
    cVar3 = StatementList::Action(pSVar4);
    pSVar4 = this->m_statement_list_ptr;
    if (cVar3 != 0) {
      if (pSVar4 != (StatementList *)0x0) {
        (pSVar4->super_AnalysisInterface)._vptr_AnalysisInterface = local_a0;
        (pSVar4->m_statement).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_00172618;
        (pSVar4->m_statement).m_switch_statement.super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_00172778;
        pcVar1 = (pSVar4->m_statement).m_switch_statement.m_bottom_label._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar1 != &(pSVar4->m_statement).m_switch_statement.m_bottom_label.field_2) {
          operator_delete(pcVar1);
        }
        (pSVar4->m_statement).m_while_loop_statement.super_AnalysisInterface._vptr_AnalysisInterface
             = (_func_int **)&PTR_Parse_00172720;
        pcVar1 = (pSVar4->m_statement).m_while_loop_statement.m_bottom_label._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar1 != &(pSVar4->m_statement).m_while_loop_statement.m_bottom_label.field_2) {
          operator_delete(pcVar1);
        }
        pcVar1 = (pSVar4->m_statement).m_while_loop_statement.m_top_label._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar1 != &(pSVar4->m_statement).m_while_loop_statement.m_top_label.field_2) {
          operator_delete(pcVar1);
        }
        (pSVar4->m_statement).m_condition_statement.super_AnalysisInterface._vptr_AnalysisInterface
             = (_func_int **)&PTR_Parse_001726c8;
        pcVar1 = (pSVar4->m_statement).m_condition_statement.m_bottom_label._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar1 != &(pSVar4->m_statement).m_condition_statement.m_bottom_label.field_2) {
          operator_delete(pcVar1);
        }
        (pSVar4->m_statement).m_assign_statement.super_AnalysisInterface._vptr_AnalysisInterface =
             local_98;
        pcVar1 = (pSVar4->m_statement).m_assign_statement.m_identifier_name._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar1 != &(pSVar4->m_statement).m_assign_statement.m_identifier_name.field_2) {
          operator_delete(pcVar1);
        }
      }
      operator_delete(pSVar4);
      goto LAB_00132733;
    }
    (*(pSVar4->super_AnalysisInterface)._vptr_AnalysisInterface[1])(pSVar4);
    pSVar4 = this->m_statement_list_ptr;
    if (pSVar4 != (StatementList *)0x0) {
      (pSVar4->super_AnalysisInterface)._vptr_AnalysisInterface = local_a0;
      (pSVar4->m_statement).super_AnalysisInterface._vptr_AnalysisInterface =
           (_func_int **)&PTR_Parse_00172618;
      (pSVar4->m_statement).m_switch_statement.super_AnalysisInterface._vptr_AnalysisInterface =
           (_func_int **)&PTR_Parse_00172778;
      pcVar1 = (pSVar4->m_statement).m_switch_statement.m_bottom_label._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 != &(pSVar4->m_statement).m_switch_statement.m_bottom_label.field_2) {
        operator_delete(pcVar1);
      }
      (pSVar4->m_statement).m_while_loop_statement.super_AnalysisInterface._vptr_AnalysisInterface =
           (_func_int **)&PTR_Parse_00172720;
      pcVar1 = (pSVar4->m_statement).m_while_loop_statement.m_bottom_label._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 != &(pSVar4->m_statement).m_while_loop_statement.m_bottom_label.field_2) {
        operator_delete(pcVar1);
      }
      pcVar1 = (pSVar4->m_statement).m_while_loop_statement.m_top_label._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 != &(pSVar4->m_statement).m_while_loop_statement.m_top_label.field_2) {
        operator_delete(pcVar1);
      }
      (pSVar4->m_statement).m_condition_statement.super_AnalysisInterface._vptr_AnalysisInterface =
           (_func_int **)&PTR_Parse_001726c8;
      pcVar1 = (pSVar4->m_statement).m_condition_statement.m_bottom_label._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 != &(pSVar4->m_statement).m_condition_statement.m_bottom_label.field_2) {
        operator_delete(pcVar1);
      }
      (pSVar4->m_statement).m_assign_statement.super_AnalysisInterface._vptr_AnalysisInterface =
           local_98;
      pcVar1 = (pSVar4->m_statement).m_assign_statement.m_identifier_name._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 != &(pSVar4->m_statement).m_assign_statement.m_identifier_name.field_2) {
        operator_delete(pcVar1);
      }
    }
    operator_delete(pSVar4);
    SVar2 = SymbolQueue::GetCurrentName(handle_correct_queue);
    cVar3 = -1;
    if (SVar2 != R_CURLY_BRACKET_SYM) goto LAB_00132752;
LAB_00132744:
    SymbolQueue::NextSymbol(handle_correct_queue);
  }
  else {
    cVar3 = OutputStatement::Action(&this->m_output_statement);
    if (cVar3 == 0) {
      OutputStatement::LogOutput(&this->m_output_statement);
LAB_00132733:
      SVar2 = SymbolQueue::GetCurrentName(handle_correct_queue);
      if (SVar2 == SEMICOLON_SYM) goto LAB_00132744;
      Action();
    }
    else {
      this_00 = handle_correct_queue;
      SymbolQueue::SetCurrentLocate(handle_correct_queue);
      cVar3 = InputStatement::Action((InputStatement *)this_00);
      if (cVar3 == 0) {
        InputStatement::LogOutput(&this->m_input_statement);
        goto LAB_00132733;
      }
      SymbolQueue::SetCurrentLocate(handle_correct_queue);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_90,local_90 + local_88);
      cVar3 = ReturnStatement::Action(&this->m_return_statement,&local_a4,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (cVar3 == 0) {
        ReturnStatement::LogOutput(&this->m_return_statement);
        goto LAB_00132733;
      }
      SymbolQueue::SetCurrentLocate(handle_correct_queue);
      cVar3 = AssignStatement::Action(&this->m_assign_statement);
      if (cVar3 == 0) {
        AssignStatement::LogOutput(&this->m_assign_statement);
        goto LAB_00132733;
      }
      SymbolQueue::SetCurrentLocate(handle_correct_queue);
      cVar3 = FunctionCall::Action(&this->m_function_call);
      if (cVar3 == 0) {
        FunctionCall::LogOutput(&this->m_function_call);
        goto LAB_00132733;
      }
      SymbolQueue::SetCurrentLocate(handle_correct_queue);
      cVar3 = ConditionStatement::Action(&this->m_condition_statement);
      if (cVar3 == 0) {
        ConditionStatement::LogOutput(&this->m_condition_statement);
      }
      else {
        SymbolQueue::SetCurrentLocate(handle_correct_queue);
        cVar3 = WhileLoopStatement::Action(&this->m_while_loop_statement);
        if (cVar3 == 0) {
          WhileLoopStatement::LogOutput(&this->m_while_loop_statement);
        }
        else {
          SymbolQueue::SetCurrentLocate(handle_correct_queue);
          cVar3 = SwitchStatement::Action(&this->m_switch_statement);
          if (cVar3 == 0) {
            SwitchStatement::LogOutput(&this->m_switch_statement);
          }
          else {
            SVar2 = SymbolQueue::GetCurrentName(handle_correct_queue);
            cVar3 = -1;
            if (SVar2 != SEMICOLON_SYM) goto LAB_00132752;
            SymbolQueue::NextSymbol(handle_correct_queue);
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_50,"This is a empty statement","");
            if (local_50[0] != local_40) {
              operator_delete(local_50[0]);
            }
          }
        }
      }
    }
  }
  cVar3 = 0;
LAB_00132752:
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  return cVar3;
}

Assistant:

compile_errcode Statement::Action() {
    int ret = COMPILE_OK;
    SymbolType function_type;
    function_type = symbol_table_tree->GetCurrentTableType();
    string funtion_name = symbol_table_tree->GetCurrentTableName();
    SymbolName name = handle_correct_queue->GetCurrentName();
    handle_correct_queue->SetCacheLocate();
    if (name == L_CURLY_BRACKET_SYM) {
        handle_correct_queue->NextSymbol();
        m_statement_list_ptr = new StatementList;
        if ((ret = m_statement_list_ptr->Action()) == COMPILE_OK) {
            m_statement_list_ptr->LogOutput();
            delete(m_statement_list_ptr);
            name = handle_correct_queue->GetCurrentName();
            if (name == R_CURLY_BRACKET_SYM) {
                handle_correct_queue->NextSymbol();
                goto NO_SEMICOLON;
            } else {
                return NOT_MATCH;
            }
        } else {
            delete(m_statement_list_ptr);
            NOT_MATCH;
        }
    } else if ((ret = m_output_statement.Action()) == COMPILE_OK) {
        m_output_statement.LogOutput();
        goto SEMICOLON_CHECK;
    } else if (handle_correct_queue->SetCurrentLocate(), (ret = m_input_statement.Action()) == COMPILE_OK) {
        m_input_statement.LogOutput();
        goto SEMICOLON_CHECK;
    } else if (handle_correct_queue->SetCurrentLocate(), (ret = m_return_statement.Action(function_type, funtion_name)) == COMPILE_OK) {
        m_return_statement.LogOutput();
        goto SEMICOLON_CHECK;
    } else if (handle_correct_queue->SetCurrentLocate(), (ret = m_assign_statement.Action()) == COMPILE_OK) {
        m_assign_statement.LogOutput();
        goto SEMICOLON_CHECK;
    } else if (handle_correct_queue->SetCurrentLocate(), (ret = m_function_call.Action()) == COMPILE_OK) {
        m_function_call.LogOutput();
        goto SEMICOLON_CHECK;
    } else if (handle_correct_queue->SetCurrentLocate(), (ret = m_condition_statement.Action()) == COMPILE_OK) {
        m_condition_statement.LogOutput();
        goto NO_SEMICOLON;
    } else if (handle_correct_queue->SetCurrentLocate(), (ret = m_while_loop_statement.Action()) == COMPILE_OK) {
        m_while_loop_statement.LogOutput();
        goto NO_SEMICOLON;
    } else if (handle_correct_queue->SetCurrentLocate(), (ret = m_switch_statement.Action()) == COMPILE_OK) {
        m_switch_statement.LogOutput();
        goto NO_SEMICOLON;
    } else {
        name = handle_correct_queue->GetCurrentName();
        if (name == SEMICOLON_SYM) {
            handle_correct_queue->NextSymbol();
            string str("This is a empty statement");
            return COMPILE_OK;
        } else {
            return NOT_MATCH;
        }
    }
    SEMICOLON_CHECK:
        name = handle_correct_queue->GetCurrentName();
        if (name == SEMICOLON_SYM) {
            handle_correct_queue->NextSymbol();
            return COMPILE_OK;
        } else {
            fprintf(stderr, "expected a ':' in the end of statement\n");
            return COMPILE_OK;
        }
    NO_SEMICOLON:
        return COMPILE_OK;
}